

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall
kratos::GeneratorConnectivityVisitor::visit(GeneratorConnectivityVisitor *this,Generator *generator)

{
  _Rb_tree_header *p_Var1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar7;
  _Base_ptr p_Var8;
  StmtException *this_00;
  ulong uVar9;
  ulong uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __hash_code __code;
  undefined8 *puVar12;
  string_view format_str;
  format_args args;
  string local_110;
  AssignStmt *local_f0;
  undefined8 uStack_e8;
  const_iterator local_d0;
  const_iterator local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined1 local_a0 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  bits;
  Stmt **ppSStack_58;
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((((generator->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (generator->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) && ((generator->is_external_ & 1U) == 0)) &&
     (generator->is_stub_ == false)) {
    p_Var8 = (generator->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(generator->ports_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      bits._M_h._M_single_bucket = (__node_base_ptr)generator;
      do {
        Generator::get_port((Generator *)
                            &stmt_list.
                             super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)generator);
        if ((*(int *)(stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x4e) != 0) ||
           (this->is_top_level_ == false)) {
          local_a0 = (undefined1  [8])&bits._M_h._M_rehash_policy._M_next_resize;
          bits._M_h._M_buckets = (__buckets_ptr)0x1;
          bits._M_h._M_bucket_count = 0;
          bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          bits._M_h._M_element_count._0_4_ = 0x3f800000;
          bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          bits._M_h._M_rehash_policy._4_4_ = 0;
          bits._M_h._M_rehash_policy._M_next_resize = 0;
          bVar3 = connected((shared_ptr<kratos::Port> *)
                            &stmt_list.
                             super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_a0);
          if (!bVar3) {
            ppSStack_58 = (Stmt **)0x0;
            stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            lVar5 = (*(code *)(*stmt_list.
                                super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->parent_)();
            for (puVar12 = *(undefined8 **)(lVar5 + 0x10); puVar12 != (undefined8 *)0x0;
                puVar12 = (undefined8 *)*puVar12) {
              local_c8._M_current = (Stmt **)puVar12[1];
              std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::
              emplace_back<kratos::AssignStmt*>
                        ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)&ppSStack_58,
                         (AssignStmt **)&local_c8);
            }
            uVar10 = 0;
            while (uVar9 = uVar10,
                  uVar4 = (*(code *)((*stmt_list.
                                       super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                    super_IRNode).comment.field_2._M_allocated_capacity)(),
                  uVar9 < uVar4) {
              aVar6 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                       )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                          *)((long)local_a0 + (uVar9 % (ulong)bits._M_h._M_buckets) * 8))->values_;
              aVar7.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0;
              if (aVar6.values_ !=
                  (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)0x0) {
                aVar2.values_ =
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)((aVar6.values_)->field_0).named_args.data;
                uVar10 = (ulong)(uint)*(int *)((long)&(aVar2.values_)->field_0 + 8);
                do {
                  aVar11 = aVar2;
                  aVar7 = aVar6;
                  if (uVar9 == uVar10) break;
                  aVar2.values_ =
                       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)((aVar11.values_)->field_0).named_args.data;
                  in_R9 = aVar11;
                  if ((named_arg_info<char> *)aVar2.values_ == (named_arg_info<char> *)0x0) {
                    aVar7.values_ =
                         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                          *)0x0;
                    break;
                  }
                  uVar10 = (ulong)(uint)*(int *)((long)&(aVar2.values_)->field_0 + 8);
                  aVar7.values_ =
                       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)0x0;
                  aVar6 = aVar11;
                } while (uVar10 % (ulong)bits._M_h._M_buckets == uVar9 % (ulong)bits._M_h._M_buckets
                        );
              }
              if ((aVar7.values_ ==
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0) || (uVar10 = uVar9 + 1, ((aVar7.values_)->field_0).long_long_value == 0))
              {
                this_00 = (StmtException *)__cxa_allocate_exception(0x10);
                (**(code **)((long)&(*stmt_list.
                                      super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)[1].
                                    super_IRNode.comment.field_2 + 8))(&local_f0);
                local_c8._M_current = (Stmt **)local_f0;
                uStack_c0 = uStack_e8;
                format_str.size_ = 0x2d;
                format_str.data_ = (char *)0x39;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .field_1.args_ = in_R9.args_;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .desc_ = (unsigned_long_long)&local_c8;
                local_b8 = uVar9;
                fmt::v7::detail::vformat_abi_cxx11_
                          (&local_110,
                           (detail *)"{0}[{1}] is a floating net. Please check your connections",
                           format_str,args);
                local_c8._M_current = ppSStack_58;
                local_d0._M_current =
                     stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                StmtException::StmtException(this_00,&local_110,&local_c8,&local_d0);
                __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
              }
            }
            generator = (Generator *)bits._M_h._M_single_bucket;
            if (ppSStack_58 != (Stmt **)0x0) {
              operator_delete(ppSStack_58,
                              (long)stmt_list.
                                    super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSStack_58);
              generator = (Generator *)bits._M_h._M_single_bucket;
            }
          }
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_a0);
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    this->is_top_level_ = false;
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        // skip if it's an external module or stub module
        if (generator->external() || generator->is_stub()) return;
        const auto& port_names = generator->get_port_names();
        for (const auto& port_name : port_names) {
            auto const& port = generator->get_port(port_name);

            // based on whether it's an input or output
            // for inputs, if it's not top generator, we need to check if
            // something is driving it
            if (port->port_direction() == PortDirection::In) {
                if (is_top_level_) continue;
            }

            std::unordered_set<uint32_t> bits;
            bool has_error = !connected(port, bits);

            if (has_error) {
                std::vector<Stmt*> stmt_list;
                for (auto const& stmt : port->sources()) {
                    stmt_list.emplace_back(stmt.get());
                }
                for (uint32_t i = 0; i < port->width(); i++) {
                    if (bits.find(i) == bits.end()) {
                        throw StmtException(
                            ::format("{0}[{1}] is a floating net. Please check your connections",
                                     port->handle_name(), i),
                            stmt_list.begin(), stmt_list.end());
                    }
                }
            }
        }

        is_top_level_ = false;
    }